

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapcache.cpp
# Opt level: O1

Key __thiscall QPMCache::insert(QPMCache *this,QPixmap *pixmap,int cost)

{
  bool bVar1;
  QPixmapCacheEntry *this_00;
  int in_ECX;
  undefined4 in_register_00000014;
  
  *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
  createKey(this);
  this_00 = (QPixmapCacheEntry *)operator_new(0x20);
  QPixmapCacheEntry::QPixmapCacheEntry
            (this_00,(Key *)this,(QPixmap *)CONCAT44(in_register_00000014,cost));
  bVar1 = QCache<QPixmapCache::Key,_QPixmapCacheEntry>::insert
                    ((QCache<QPixmapCache::Key,_QPixmapCacheEntry> *)&pixmap->data,(Key *)this,
                     this_00,(long)in_ECX);
  if ((bVar1) && (*(int *)&pixmap[4].super_QPaintDevice._vptr_QPaintDevice == 0)) {
    QBasicTimer::start(pixmap + 4,30000000000,1,pixmap);
    *(undefined1 *)&pixmap[5].super_QPaintDevice._vptr_QPaintDevice = 0;
  }
  return (Key)(KeyData *)this;
}

Assistant:

QPixmapCache::Key QPMCache::insert(const QPixmap &pixmap, int cost)
{
    QPixmapCache::Key cacheKey = createKey(); // invalidated by ~QPixmapCacheEntry on failed insert
    bool success = QCache<QPixmapCache::Key, QPixmapCacheEntry>::insert(cacheKey, new QPixmapCacheEntry(cacheKey, pixmap), cost);
    Q_ASSERT(success || !cacheKey.isValid());
    if (success) {
        if (!timer.isActive()) {
            timer.start(flush_time, this);
            t = false;
        }
    }
    return cacheKey;
}